

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O1

int candle_light_range(obj *obj)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  
  if ((ushort)obj->otyp - 0xe5 < 2) {
    iVar2 = 1;
    lVar3 = (long)obj->quan;
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 6 < lVar3;
      lVar3 = lVar3 / 7;
    } while (bVar1);
  }
  else {
    iVar2 = 3;
    if (obj->otyp == 0x10b) {
      iVar2 = 2;
      if ('\x03' < obj->spe) {
        iVar2 = ('\x06' < obj->spe) + 3;
      }
    }
  }
  return iVar2;
}

Assistant:

int candle_light_range(struct obj *obj)
{
    int radius;

    if (obj->otyp == CANDELABRUM_OF_INVOCATION) {
	/*
	 *	The special candelabrum emits more light than the
	 *	corresponding number of candles would.
	 *	 1..3 candles, range 2 (minimum range);
	 *	 4..6 candles, range 3 (normal lamp range);
	 *	    7 candles, range 4 (bright).
	 */
	radius = (obj->spe < 4) ? 2 : (obj->spe < 7) ? 3 : 4;
    } else if (Is_candle(obj)) {
	/*
	 *	Range is incremented by powers of 7 so that it will take
	 *	wizard mode quantities of candles to get more light than
	 *	from a lamp, without imposing an arbitrary limit.
	 *	 1..6   candles, range 2;
	 *	 7..48  candles, range 3;
	 *	49..342 candles, range 4; &c.
	 */
	long n = obj->quan;

	radius = 1;	/* always incremented at least once */
	do {
	    radius++;
	    n /= 7L;
	} while (n > 0L);
    } else {
	/* we're only called for lit candelabrum or candles */
     /* impossible("candlelight for %d?", obj->otyp); */
	radius = 3;		/* lamp's value */
    }
    return radius;
}